

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void armci_write_strided(void *ptr,int stride_levels,int *stride_arr,int *count,char *buf)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  stride_info_t sitr;
  stride_info_t local_98;
  
  __n = (size_t)*count;
  if (0 < (long)__n) {
    armci_stride_info_init(&local_98,ptr,stride_levels,stride_arr,count);
    if (local_98.pos < local_98.size) {
      lVar3 = 0;
      do {
        if ((long)local_98.stride_levels < 1) {
          lVar1 = 0;
        }
        else {
          lVar1 = 0;
          iVar2 = 0;
          do {
            iVar2 = iVar2 + local_98.stride_arr[lVar1] * local_98.itr[lVar1];
            lVar1 = lVar1 + 1;
          } while (local_98.stride_levels != lVar1);
          lVar1 = (long)iVar2;
        }
        memcpy(buf + lVar3,local_98.base_ptr + lVar1,__n);
        lVar3 = lVar3 + __n;
        armci_stride_info_next(&local_98);
      } while (local_98.pos < local_98.size);
    }
    return;
  }
  __assert_fail("count[0]>0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0xa5,"void armci_write_strided(void *, int, int *, int *, char *)");
}

Assistant:

void armci_write_strided(
        void *ptr, int stride_levels, int stride_arr[], int count[], char *buf)
{
  const int seg_size = count[0];
  int off;
  stride_info_t sitr;
  off=0;
  assert(count[0]>0);
  armci_stride_info_init(&sitr,ptr,stride_levels,stride_arr,count);
  while(armci_stride_info_has_more(&sitr)) {
    char *sptr = armci_stride_info_seg_ptr(&sitr);
    memcpy(&buf[off],sptr,seg_size);
    off += seg_size;
    armci_stride_info_next(&sitr);
  }
  armci_stride_info_destroy(&sitr);
}